

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_iCCP(LodePNGInfo *info,LodePNGDecoderSettings *decoder,uchar *data,size_t chunkLength
                   )

{
  char *pcVar1;
  bool bVar2;
  uint local_6c;
  uint string2_begin;
  uint length;
  LodePNGDecompressSettings zlibsettings;
  size_t size;
  uint i;
  uint error;
  size_t chunkLength_local;
  uchar *data_local;
  LodePNGDecoderSettings *decoder_local;
  LodePNGInfo *info_local;
  
  zlibsettings.custom_context = (void *)0x0;
  memcpy(&string2_begin,decoder,0x28);
  info->iccp_defined = 1;
  if (info->iccp_name != (char *)0x0) {
    lodepng_clear_icc(info);
  }
  local_6c = 0;
  while( true ) {
    bVar2 = false;
    if (local_6c < chunkLength) {
      bVar2 = data[local_6c] != '\0';
    }
    if (!bVar2) break;
    local_6c = local_6c + 1;
  }
  if (local_6c + 2 < chunkLength) {
    if ((local_6c == 0) || (0x4f < local_6c)) {
      info_local._4_4_ = 0x59;
    }
    else {
      pcVar1 = (char *)lodepng_malloc((ulong)(local_6c + 1));
      info->iccp_name = pcVar1;
      if (info->iccp_name == (char *)0x0) {
        info_local._4_4_ = 0x53;
      }
      else {
        info->iccp_name[local_6c] = '\0';
        for (size._0_4_ = 0; (uint)size != local_6c; size._0_4_ = (uint)size + 1) {
          info->iccp_name[(uint)size] = data[(uint)size];
        }
        if (data[local_6c + 1] == '\0') {
          local_6c = local_6c + 2;
          if (chunkLength < local_6c) {
            info_local._4_4_ = 0x4b;
          }
          else {
            zlibsettings._0_8_ = decoder->max_icc_size;
            size._4_4_ = zlib_decompress(&info->iccp_profile,(size_t *)&zlibsettings.custom_context,
                                         0,data + local_6c,(ulong)((int)chunkLength - local_6c),
                                         (LodePNGDecompressSettings *)&string2_begin);
            if ((size._4_4_ != 0) && ((ulong)zlibsettings._0_8_ < zlibsettings.custom_context)) {
              size._4_4_ = 0x71;
            }
            info->iccp_profile_size = (uint)zlibsettings.custom_context;
            if ((size._4_4_ == 0) && (info->iccp_profile_size == 0)) {
              size._4_4_ = 100;
            }
            info_local._4_4_ = size._4_4_;
          }
        }
        else {
          info_local._4_4_ = 0x48;
        }
      }
    }
  }
  else {
    info_local._4_4_ = 0x4b;
  }
  return info_local._4_4_;
}

Assistant:

static unsigned readChunk_iCCP(LodePNGInfo* info, const LodePNGDecoderSettings* decoder,
                               const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;
  unsigned i;
  size_t size = 0;
  /*copy the object to change parameters in it*/
  LodePNGDecompressSettings zlibsettings = decoder->zlibsettings;

  unsigned length, string2_begin;

  info->iccp_defined = 1;
  if(info->iccp_name) lodepng_clear_icc(info);

  for(length = 0; length < chunkLength && data[length] != 0; ++length) ;
  if(length + 2 >= chunkLength) return 75; /*no null termination, corrupt?*/
  if(length < 1 || length > 79) return 89; /*keyword too short or long*/

  info->iccp_name = (char*)lodepng_malloc(length + 1);
  if(!info->iccp_name) return 83; /*alloc fail*/

  info->iccp_name[length] = 0;
  for(i = 0; i != length; ++i) info->iccp_name[i] = (char)data[i];

  if(data[length + 1] != 0) return 72; /*the 0 byte indicating compression must be 0*/

  string2_begin = length + 2;
  if(string2_begin > chunkLength) return 75; /*no null termination, corrupt?*/

  length = (unsigned)chunkLength - string2_begin;
  zlibsettings.max_output_size = decoder->max_icc_size;
  error = zlib_decompress(&info->iccp_profile, &size, 0,
                          &data[string2_begin],
                          length, &zlibsettings);
  /*error: ICC profile larger than  decoder->max_icc_size*/
  if(error && size > zlibsettings.max_output_size) error = 113;
  info->iccp_profile_size = (unsigned)size;
  if(!error && !info->iccp_profile_size) error = 100; /*invalid ICC profile size*/
  return error;
}